

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_test.cc
# Opt level: O0

int test_describe_cash_detail(void)

{
  code *pcVar1;
  char *__s;
  BssDescribeCashDetailResponseType *pBVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1f1;
  int ret;
  HttpTestListener *local_1d0;
  HttpTestListener *listener;
  string local_1c0;
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [55];
  allocator<char> local_139;
  string local_138 [32];
  BssDescribeCashDetailResponseType *local_118;
  Bss *bss;
  BssDescribeCashDetailResponseType resp;
  
  aliyun::BssDescribeCashDetailResponseType::BssDescribeCashDetailResponseType
            ((BssDescribeCashDetailResponseType *)&bss);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"cn-hangzhou",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"my_appid",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"my_secret",&local_199);
  pBVar2 = (BssDescribeCashDetailResponseType *)
           aliyun::Bss::CreateBssClient(local_138,local_170,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  local_118 = pBVar2;
  if (pBVar2 == (BssDescribeCashDetailResponseType *)0x0) {
    aliyun::BssDescribeCashDetailResponseType::~BssDescribeCashDetailResponseType
              ((BssDescribeCashDetailResponseType *)&bss);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Bss::SetProxyHost((Bss *)pBVar2,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Bss::SetUseTls((Bss *)local_118,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_cash_detail_response;
  local_1d0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1f1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1f1);
  HttpTestListener::Start(local_1d0);
  aliyun::Bss::DescribeCashDetail(local_118,(BssErrorInfo *)&bss);
  HttpTestListener::WaitComplete(local_1d0);
  pHVar3 = local_1d0;
  if (local_1d0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1d0);
    operator_delete(pHVar3,0x180);
  }
  pBVar2 = local_118;
  if (local_118 != (BssDescribeCashDetailResponseType *)0x0) {
    aliyun::Bss::~Bss((Bss *)local_118);
    operator_delete(pBVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_cash_detail() {
  BssDescribeCashDetailResponseType resp;
  Bss* bss = Bss::CreateBssClient("cn-hangzhou", "my_appid", "my_secret");
  if(!bss) return 0;
  bss->SetProxyHost("127.0.0.1:12234");
  bss->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_cash_detail_response);
  listener->Start();
  int ret = bss->DescribeCashDetail(&resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete bss;
}